

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.c
# Opt level: O3

void Pointer_create(Pointer *p,size_t n,Bool_t is_using_device)

{
  if (p == (Pointer *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/pointer.c"
                  ,0x28,"void Pointer_create(Pointer *, size_t, Bool_t)");
  }
  if (n != 0xffffffffffffffff) {
    p->h_ = (P *)0x0;
    p->d_ = (P *)0x0;
    p->n_ = n;
    p->is_using_device_ = is_using_device;
    p->is_pinned_ = 0;
    p->is_alias_ = 0;
    return;
  }
  __assert_fail("n+1 >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/pointer.c"
                ,0x29,"void Pointer_create(Pointer *, size_t, Bool_t)");
}

Assistant:

void Pointer_create( Pointer* p,
                     size_t   n,
                     Bool_t   is_using_device )
{
  Assert( p );
  Assert( n+1 >= 1 );

  p->h_ = NULL;
  p->d_ = NULL;
  p->n_ = n;
  p->is_using_device_ = is_using_device;
  p->is_pinned_ = Bool_false;
  p->is_alias_  = Bool_false;
}